

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

_Bool btorsim_bv_is_one(BtorSimBitVector *bv)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = (ulong)(bv->len - 1);
  if ((&bv[1].width)[uVar1] != 1) {
    return false;
  }
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      bVar3 = (&bv[1].width)[lVar2] == 0;
      if (!bVar3) {
        return bVar3;
      }
      bVar4 = uVar1 - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
    return bVar3;
  }
  return true;
}

Assistant:

bool
btorsim_bv_is_one (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;

  if (bv->bits[bv->len - 1] != 1) return false;
  for (i = 0; i < bv->len - 1; i++)
    if (bv->bits[i] != 0) return false;
  return true;
}